

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O0

char * ngx_http_index_merge_loc_conf(ngx_conf_t *cf,void *parent,void *child)

{
  ngx_array_t *pnVar1;
  undefined8 *puVar2;
  ngx_http_index_t *index;
  ngx_http_index_loc_conf_t *conf;
  ngx_http_index_loc_conf_t *prev;
  void *child_local;
  void *parent_local;
  ngx_conf_t *cf_local;
  
  if (*child == 0) {
    *(undefined8 *)child = *parent;
    *(undefined8 *)((long)child + 8) = *(undefined8 *)((long)parent + 8);
  }
  if (*child == 0) {
    pnVar1 = ngx_array_create(cf->pool,1,0x20);
    *(ngx_array_t **)child = pnVar1;
    if (*child == 0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      puVar2 = (undefined8 *)ngx_array_push(*child);
      if (puVar2 == (undefined8 *)0x0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        *puVar2 = 0xb;
        puVar2[1] = "index.html";
        puVar2[2] = 0;
        puVar2[3] = 0;
        *(undefined8 *)((long)child + 8) = 0xb;
        cf_local = (ngx_conf_t *)0x0;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)0x0;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_index_merge_loc_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_index_loc_conf_t  *prev = parent;
    ngx_http_index_loc_conf_t  *conf = child;

    ngx_http_index_t  *index;

    if (conf->indices == NULL) {
        conf->indices = prev->indices;
        conf->max_index_len = prev->max_index_len;
    }

    if (conf->indices == NULL) {
        conf->indices = ngx_array_create(cf->pool, 1, sizeof(ngx_http_index_t));
        if (conf->indices == NULL) {
            return NGX_CONF_ERROR;
        }

        index = ngx_array_push(conf->indices);
        if (index == NULL) {
            return NGX_CONF_ERROR;
        }

        index->name.len = sizeof(NGX_HTTP_DEFAULT_INDEX);
        index->name.data = (u_char *) NGX_HTTP_DEFAULT_INDEX;
        index->lengths = NULL;
        index->values = NULL;

        conf->max_index_len = sizeof(NGX_HTTP_DEFAULT_INDEX);

        return NGX_CONF_OK;
    }

    return NGX_CONF_OK;
}